

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLockLock::ChLinkLockLock(ChLinkLockLock *this,ChLinkLockLock *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined1 auVar4 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChLinkLock::ChLinkLock(&this->super_ChLinkLock,&other->super_ChLinkLock);
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkLockLock_00b3e5e8;
  (this->relC).pos.m_data[0] = 0.0;
  (this->relC).pos.m_data[1] = 0.0;
  (this->relC).pos.m_data[2] = 0.0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_axis).m_data[0] = 0.0;
  (this->motion_axis).m_data[1] = 0.0;
  (this->motion_axis).m_data[2] = 0.0;
  (this->relC).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->relC).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->relC).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->relC_dt).rot.m_data[0] = 1.0;
  auVar4 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->relC_dt).rot.m_data + 1) = auVar4;
  *(undefined1 (*) [32])((this->relC_dt).rot.m_data + 3) = auVar4;
  (this->relC_dtdt).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->relC_dtdt).rot.m_data + 1) = auVar4;
  *(undefined1 (*) [32])((this->relC_dtdt).rot.m_data + 3) = auVar4;
  (this->deltaC).rot.m_data[0] = 1.0;
  auVar4 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->deltaC).rot.m_data + 3) = auVar4;
  *(undefined1 (*) [32])((this->deltaC).rot.m_data + 1) = auVar4;
  (this->deltaC_dt).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->deltaC_dt).rot.m_data + 3) = auVar4;
  *(undefined1 (*) [32])((this->deltaC_dt).rot.m_data + 1) = auVar4;
  (this->deltaC_dtdt).rot.m_data[0] = 1.0;
  (this->deltaC_dtdt).rot.m_data[1] = 0.0;
  (this->deltaC_dtdt).rot.m_data[2] = 0.0;
  (this->deltaC_dtdt).rot.m_data[3] = 0.0;
  (this->super_ChLinkLock).type = LOCK;
  ChLinkMaskLF::SetLockMask(&(this->super_ChLinkLock).mask,true,true,true,false,true,true,true);
  ChLinkLock::BuildLink(&this->super_ChLinkLock);
  iVar3 = (*((other->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var,iVar3));
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var,iVar3);
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar3 = (*((other->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_00,iVar3));
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_00,iVar3);
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar3 = (*((other->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_01,iVar3));
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_01,iVar3);
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar3 = (*((other->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_02,iVar3));
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_02,iVar3);
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar3 = (*((other->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_03,iVar3));
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_03,iVar3);
  (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar3 = (*((other->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_04,iVar3));
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_04,iVar3);
  (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  if (other != this) {
    (this->motion_axis).m_data[0] = (other->motion_axis).m_data[0];
    (this->motion_axis).m_data[1] = (other->motion_axis).m_data[1];
    (this->motion_axis).m_data[2] = (other->motion_axis).m_data[2];
  }
  this->angleset = other->angleset;
  if (other != this) {
    (this->deltaC).pos.m_data[0] = (other->deltaC).pos.m_data[0];
    (this->deltaC).pos.m_data[1] = (other->deltaC).pos.m_data[1];
    (this->deltaC).pos.m_data[2] = (other->deltaC).pos.m_data[2];
    (this->deltaC).rot.m_data[0] = (other->deltaC).rot.m_data[0];
    (this->deltaC).rot.m_data[1] = (other->deltaC).rot.m_data[1];
    (this->deltaC).rot.m_data[2] = (other->deltaC).rot.m_data[2];
    (this->deltaC).rot.m_data[3] = (other->deltaC).rot.m_data[3];
    (this->deltaC_dt).pos.m_data[0] = (other->deltaC_dt).pos.m_data[0];
    (this->deltaC_dt).pos.m_data[1] = (other->deltaC_dt).pos.m_data[1];
    (this->deltaC_dt).pos.m_data[2] = (other->deltaC_dt).pos.m_data[2];
    (this->deltaC_dt).rot.m_data[0] = (other->deltaC_dt).rot.m_data[0];
    (this->deltaC_dt).rot.m_data[1] = (other->deltaC_dt).rot.m_data[1];
    (this->deltaC_dt).rot.m_data[2] = (other->deltaC_dt).rot.m_data[2];
    (this->deltaC_dt).rot.m_data[3] = (other->deltaC_dt).rot.m_data[3];
    (this->deltaC_dtdt).pos.m_data[0] = (other->deltaC_dtdt).pos.m_data[0];
    (this->deltaC_dtdt).pos.m_data[1] = (other->deltaC_dtdt).pos.m_data[1];
    (this->deltaC_dtdt).pos.m_data[2] = (other->deltaC_dtdt).pos.m_data[2];
    (this->deltaC_dtdt).rot.m_data[0] = (other->deltaC_dtdt).rot.m_data[0];
    (this->deltaC_dtdt).rot.m_data[1] = (other->deltaC_dtdt).rot.m_data[1];
    (this->deltaC_dtdt).rot.m_data[2] = (other->deltaC_dtdt).rot.m_data[2];
    (this->deltaC_dtdt).rot.m_data[3] = (other->deltaC_dtdt).rot.m_data[3];
    (this->relC).pos.m_data[0] = (other->relC).pos.m_data[0];
    (this->relC).pos.m_data[1] = (other->relC).pos.m_data[1];
    (this->relC).pos.m_data[2] = (other->relC).pos.m_data[2];
    (this->relC).rot.m_data[0] = (other->relC).rot.m_data[0];
    (this->relC).rot.m_data[1] = (other->relC).rot.m_data[1];
    (this->relC).rot.m_data[2] = (other->relC).rot.m_data[2];
    (this->relC).rot.m_data[3] = (other->relC).rot.m_data[3];
    (this->relC_dt).pos.m_data[0] = (other->relC_dt).pos.m_data[0];
    (this->relC_dt).pos.m_data[1] = (other->relC_dt).pos.m_data[1];
    (this->relC_dt).pos.m_data[2] = (other->relC_dt).pos.m_data[2];
    (this->relC_dt).rot.m_data[0] = (other->relC_dt).rot.m_data[0];
    (this->relC_dt).rot.m_data[1] = (other->relC_dt).rot.m_data[1];
    (this->relC_dt).rot.m_data[2] = (other->relC_dt).rot.m_data[2];
    (this->relC_dt).rot.m_data[3] = (other->relC_dt).rot.m_data[3];
    (this->relC_dtdt).pos.m_data[0] = (other->relC_dtdt).pos.m_data[0];
    (this->relC_dtdt).pos.m_data[1] = (other->relC_dtdt).pos.m_data[1];
    (this->relC_dtdt).pos.m_data[2] = (other->relC_dtdt).pos.m_data[2];
    (this->relC_dtdt).rot.m_data[0] = (other->relC_dtdt).rot.m_data[0];
    (this->relC_dtdt).rot.m_data[1] = (other->relC_dtdt).rot.m_data[1];
    (this->relC_dtdt).rot.m_data[2] = (other->relC_dtdt).rot.m_data[2];
    (this->relC_dtdt).rot.m_data[3] = (other->relC_dtdt).rot.m_data[3];
  }
  return;
}

Assistant:

ChLinkLockLock::ChLinkLockLock(const ChLinkLockLock& other) : ChLinkLock(other) {
    type = LinkType::LOCK;
    BuildLink(true, true, true, false, true, true, true);

    motion_X = std::shared_ptr<ChFunction>(other.motion_X->Clone());
    motion_Y = std::shared_ptr<ChFunction>(other.motion_Y->Clone());
    motion_Z = std::shared_ptr<ChFunction>(other.motion_Z->Clone());
    motion_ang = std::shared_ptr<ChFunction>(other.motion_ang->Clone());
    motion_ang2 = std::shared_ptr<ChFunction>(other.motion_ang2->Clone());
    motion_ang3 = std::shared_ptr<ChFunction>(other.motion_ang3->Clone());

    motion_axis = other.motion_axis;
    angleset = other.angleset;

    deltaC = other.deltaC;
    deltaC_dt = other.deltaC_dt;
    deltaC_dtdt = other.deltaC_dtdt;
    relC = other.relC;
    relC_dt = other.relC_dt;
    relC_dtdt = other.relC_dtdt;
}